

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O0

bool __thiscall labelling::Label::fullDominance(Label *this,Label *other,Directions *direction)

{
  bool bVar1;
  double *in_RSI;
  double *in_RDI;
  Directions *in_stack_00000008;
  bool *this_dominates_flipped;
  Directions flipped_direction;
  bool result;
  bool *other_dominates;
  bool *this_dominates;
  bool local_3a;
  undefined1 local_39;
  undefined1 *local_38;
  byte local_29;
  byte *local_28;
  double *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  local_29 = checkDominance(_flipped_direction,(Label *)this_dominates_flipped,in_stack_00000008);
  local_28 = &local_29;
  local_39 = checkDominance(_flipped_direction,(Label *)this_dominates_flipped,in_stack_00000008);
  local_38 = &local_39;
  if ((*local_28 & 1) == 0) {
    local_3a = false;
    if ((((*local_28 & 1) == 0) && (!(bool)local_39)) &&
       ((bVar1 = checkDominance(_flipped_direction,(Label *)this_dominates_flipped,in_stack_00000008
                               ), bVar1 || (*in_RDI < *local_18)))) {
      local_3a = true;
    }
    local_1 = local_3a;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Label::fullDominance(
    const Label&                     other,
    const bidirectional::Directions& direction) const {
  const bool& this_dominates  = checkDominance(other, direction);
  const bool& other_dominates = checkDominance(other, direction);

  if (this_dominates)
    return true;

  bool result = false;
  if (!this_dominates && !other_dominates) {
    bidirectional::Directions flipped_direction;
    if (direction == bidirectional::FWD)
      flipped_direction = bidirectional::BWD;
    else
      flipped_direction = bidirectional::FWD;
    const bool& this_dominates_flipped =
        checkDominance(other, flipped_direction);
    if (this_dominates_flipped || weight < other.weight)
      result = true;
  }
  return result;
}